

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::intEqualsAfterUintCast
               (deInt32 value,deUint32 casted,Precision precision)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  deUint32 reference;
  
  if (precision < PRECISION_LAST) {
    uVar1 = *(ulong *)(&DAT_00981fb8 + (ulong)precision * 8);
  }
  else {
    uVar1 = 0;
  }
  uVar3 = (uint)(-1L << ((byte)uVar1 & 0x3f));
  if (((casted ^ value) & ~uVar3) != 0) {
    return false;
  }
  if (((~(uint)(-1L << ((byte)uVar1 & 0x3f)) & value >> 0x1f ^ casted) & uVar3) == 0) {
    return true;
  }
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x20) break;
    uVar1 = uVar2 + 1;
  } while (((~(uint)(-2L << ((byte)uVar2 & 0x3f)) & value >> 0x1f ^ casted) & uVar3) != 0);
  return uVar2 < 0x20;
}

Assistant:

static int getPrecisionNumIntegerBits (glu::Precision precision)
{
	switch (precision)
	{
		case glu::PRECISION_HIGHP:		return 32;
		case glu::PRECISION_MEDIUMP:	return 16;
		case glu::PRECISION_LOWP:		return 9;
		default:
			DE_ASSERT(false);
			return 0;
	}
}